

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char sqlite3AffinityType(char *zIn,u8 *pszEst)

{
  byte bVar1;
  byte *pbVar2;
  char cVar3;
  uint uVar4;
  byte bVar5;
  byte *zNum;
  uint uVar6;
  int local_1c;
  
  bVar5 = 0x43;
  uVar4 = 0;
  zNum = (byte *)0x0;
LAB_002519ee:
  pbVar2 = (byte *)zIn + 1;
  bVar1 = *zIn;
  if ((ulong)bVar1 == 0) {
    if (pszEst == (u8 *)0x0) {
      return bVar5;
    }
    *pszEst = '\x01';
    if (bVar5 < 0x43) {
      if (zNum == (byte *)0x0) {
        *pszEst = '\x05';
        return bVar5;
      }
      while( true ) {
        if ((ulong)*zNum == 0) {
          return bVar5;
        }
        if (0xfffffffffffffff5 < (ulong)*zNum - 0x3a) break;
        zNum = zNum + 1;
      }
      local_1c = 0;
      sqlite3GetInt32((char *)zNum,&local_1c);
      cVar3 = -2;
      if ((int)((long)local_1c / 4) < 0xfe) {
        cVar3 = (char)((long)local_1c / 4);
      }
      *pszEst = cVar3 + '\x01';
      return bVar5;
    }
    return bVar5;
  }
  uVar6 = uVar4 << 8;
  uVar4 = ""[bVar1] | uVar6;
  zIn = (char *)pbVar2;
  if (uVar4 == 0x626c6f62) {
    if ((bVar5 == 0x45) || (bVar5 == 0x43)) {
      if (*pbVar2 == 0x28) {
        zNum = pbVar2;
      }
      bVar5 = 0x41;
      goto LAB_002519ee;
    }
  }
  else {
    if (uVar4 == 0x63686172) {
      bVar5 = 0x42;
      zNum = pbVar2;
      goto LAB_002519ee;
    }
    if ((uVar4 == 0x74657874) || (uVar4 == 0x636c6f62)) {
      bVar5 = 0x42;
      goto LAB_002519ee;
    }
  }
  if ((uVar4 == 0x646f7562 || (uVar4 == 0x666c6f61 || uVar4 == 0x7265616c)) && bVar5 == 0x43) {
    bVar5 = 0x45;
  }
  else if (((uint)""[bVar1] | uVar6 & 0xffffff) == 0x696e74) {
    if (pszEst != (u8 *)0x0) {
      *pszEst = '\x01';
    }
    return 'D';
  }
  goto LAB_002519ee;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, u8 *pszEst){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pszEst is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pszEst ){
    *pszEst = 1;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            int v = 0;
            sqlite3GetInt32(zChar, &v);
            v = v/4 + 1;
            if( v>255 ) v = 255;
            *pszEst = v; /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            break;
          }
          zChar++;
        }
      }else{
        *pszEst = 5;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
  }
  return aff;
}